

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersector1<4,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  Geometry *this;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 (*pauVar11) [16];
  bool bVar12;
  bool bVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  long lVar20;
  byte bVar21;
  size_t i;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  long local_1030;
  long local_1028;
  ulong local_1020;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_1048 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    local_1048 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  }
  pauVar18 = (undefined1 (*) [16])local_f68;
  uVar1 = *(undefined4 *)&(query->p).field_0;
  local_f98._4_4_ = uVar1;
  local_f98._0_4_ = uVar1;
  local_f98._8_4_ = uVar1;
  local_f98._12_4_ = uVar1;
  auVar30 = ZEXT1664(local_f98);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_fa8._4_4_ = uVar1;
  local_fa8._0_4_ = uVar1;
  local_fa8._8_4_ = uVar1;
  local_fa8._12_4_ = uVar1;
  auVar31 = ZEXT1664(local_fa8);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fb8._4_4_ = uVar1;
  local_fb8._0_4_ = uVar1;
  local_fb8._8_4_ = uVar1;
  local_fb8._12_4_ = uVar1;
  auVar32 = ZEXT1664(local_fb8);
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  bVar13 = false;
  do {
    local_fc8 = vsubps_avx(auVar30._0_16_,auVar23);
    fVar5 = auVar23._0_4_;
    fVar6 = auVar23._4_4_;
    fVar7 = auVar23._8_4_;
    fVar8 = auVar23._12_4_;
    local_fd8 = auVar30._0_4_ + fVar5;
    fStack_fd4 = auVar30._4_4_ + fVar6;
    fStack_fd0 = auVar30._8_4_ + fVar7;
    fStack_fcc = auVar30._12_4_ + fVar8;
    local_fe8 = vsubps_avx(auVar31._0_16_,auVar25);
    local_ff8 = auVar31._0_4_ + auVar25._0_4_;
    fStack_ff4 = auVar31._4_4_ + auVar25._4_4_;
    fStack_ff0 = auVar31._8_4_ + auVar25._8_4_;
    fStack_fec = auVar31._12_4_ + auVar25._12_4_;
    local_1008 = vsubps_avx(auVar32._0_16_,auVar27);
    local_1018._0_4_ = auVar32._0_4_ + auVar27._0_4_;
    local_1018._4_4_ = auVar32._4_4_ + auVar27._4_4_;
    local_1018._8_4_ = auVar32._8_4_ + auVar27._8_4_;
    local_1018._12_4_ = auVar32._12_4_ + auVar27._12_4_;
    local_f88._0_4_ = fVar5 * fVar5;
    local_f88._4_4_ = fVar6 * fVar6;
    local_f88._8_4_ = fVar7 * fVar7;
    local_f88._12_4_ = fVar8 * fVar8;
    auVar33 = ZEXT1664(local_f88);
LAB_0148e540:
    do {
      do {
        if (pauVar18 == (undefined1 (*) [16])&local_f78) {
          return bVar13;
        }
        pauVar11 = pauVar18 + -1;
        pauVar18 = pauVar18 + -1;
      } while ((float)local_1048._0_4_ < *(float *)(*pauVar11 + 8));
      uVar15 = *(ulong *)*pauVar18;
LAB_0148e568:
      auVar23 = auVar30._0_16_;
      auVar25 = auVar31._0_16_;
      auVar27 = auVar32._0_16_;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar15 & 8) != 0) goto LAB_0148e873;
        auVar9 = *(undefined1 (*) [16])(uVar15 + 0x20);
        auVar24 = *(undefined1 (*) [16])(uVar15 + 0x30);
        auVar10 = vmaxps_avx(auVar23,auVar9);
        auVar10 = vminps_avx(auVar10,auVar24);
        auVar10 = vsubps_avx(auVar10,auVar23);
        auVar23 = vmaxps_avx(auVar25,*(undefined1 (*) [16])(uVar15 + 0x40));
        auVar23 = vminps_avx(auVar23,*(undefined1 (*) [16])(uVar15 + 0x50));
        auVar25 = vsubps_avx(auVar23,auVar25);
        auVar23 = vmaxps_avx(auVar27,*(undefined1 (*) [16])(uVar15 + 0x60));
        auVar23 = vminps_avx(auVar23,*(undefined1 (*) [16])(uVar15 + 0x70));
        auVar23 = vsubps_avx(auVar23,auVar27);
        local_1058._4_4_ =
             auVar10._4_4_ * auVar10._4_4_ + auVar25._4_4_ * auVar25._4_4_ +
             auVar23._4_4_ * auVar23._4_4_;
        local_1058._0_4_ =
             auVar10._0_4_ * auVar10._0_4_ + auVar25._0_4_ * auVar25._0_4_ +
             auVar23._0_4_ * auVar23._0_4_;
        fStack_1050 = auVar10._8_4_ * auVar10._8_4_ + auVar25._8_4_ * auVar25._8_4_ +
                      auVar23._8_4_ * auVar23._8_4_;
        fStack_104c = auVar10._12_4_ * auVar10._12_4_ + auVar25._12_4_ * auVar25._12_4_ +
                      auVar23._12_4_ * auVar23._12_4_;
        auVar23 = vcmpps_avx(auVar9,auVar24,2);
        auVar25 = vcmpps_avx(*(undefined1 (*) [16])(uVar15 + 0x50),local_fe8,5);
        auVar23 = vandps_avx(auVar23,auVar25);
        auVar10._4_4_ = fStack_fd4;
        auVar10._0_4_ = local_fd8;
        auVar10._8_4_ = fStack_fd0;
        auVar10._12_4_ = fStack_fcc;
        auVar25 = vcmpps_avx(auVar9,auVar10,2);
        auVar9._4_4_ = fStack_ff4;
        auVar9._0_4_ = local_ff8;
        auVar9._8_4_ = fStack_ff0;
        auVar9._12_4_ = fStack_fec;
        auVar27 = vcmpps_avx(*(undefined1 (*) [16])(uVar15 + 0x40),auVar9,2);
        auVar25 = vandps_avx(auVar27,auVar25);
        auVar27 = vcmpps_avx(*(undefined1 (*) [16])(uVar15 + 0x70),local_1008,5);
        auVar23 = vandps_avx(auVar23,auVar27);
        auVar27 = vcmpps_avx(auVar24,local_fc8,5);
        auVar9 = vcmpps_avx(*(undefined1 (*) [16])(uVar15 + 0x60),local_1018,2);
        auVar27 = vandps_avx(auVar9,auVar27);
        auVar25 = vandps_avx(auVar25,auVar27);
        auVar23 = vandps_avx(auVar25,auVar23);
LAB_0148e5e0:
        auVar23 = vpslld_avx(auVar23,0x1f);
        uVar14 = vmovmskps_avx(auVar23);
        if (uVar14 != 0) {
          uVar14 = uVar14 & 0xff;
          uVar19 = uVar15 & 0xfffffffffffffff0;
          lVar20 = 0;
          for (uVar15 = (ulong)uVar14; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000)
          {
            lVar20 = lVar20 + 1;
          }
          uVar15 = *(ulong *)(uVar19 + lVar20 * 8);
          uVar14 = uVar14 - 1 & uVar14;
          uVar16 = (ulong)uVar14;
          if (uVar14 != 0) {
            uVar3 = *(uint *)(local_1058 + lVar20 * 4);
            lVar20 = 0;
            for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
            uVar14 = uVar14 - 1 & uVar14;
            uVar17 = (ulong)uVar14;
            uVar16 = *(ulong *)(uVar19 + lVar20 * 8);
            uVar4 = *(uint *)(local_1058 + lVar20 * 4);
            if (uVar14 == 0) {
              if (uVar3 < uVar4) {
                *(ulong *)*pauVar18 = uVar16;
                *(uint *)(*pauVar18 + 8) = uVar4;
                pauVar18 = pauVar18 + 1;
              }
              else {
                *(ulong *)*pauVar18 = uVar15;
                *(uint *)(*pauVar18 + 8) = uVar3;
                pauVar18 = pauVar18 + 1;
                uVar15 = uVar16;
              }
            }
            else {
              auVar24._8_8_ = 0;
              auVar24._0_8_ = uVar15;
              auVar23 = vpunpcklqdq_avx(auVar24,ZEXT416(uVar3));
              auVar26._8_8_ = 0;
              auVar26._0_8_ = uVar16;
              auVar25 = vpunpcklqdq_avx(auVar26,ZEXT416(uVar4));
              lVar20 = 0;
              for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              uVar14 = uVar14 - 1 & uVar14;
              uVar15 = (ulong)uVar14;
              auVar28._8_8_ = 0;
              auVar28._0_8_ = *(ulong *)(uVar19 + lVar20 * 8);
              auVar9 = vpunpcklqdq_avx(auVar28,ZEXT416(*(uint *)(local_1058 + lVar20 * 4)));
              auVar27 = vpcmpgtd_avx(auVar25,auVar23);
              if (uVar14 == 0) {
                auVar24 = vpshufd_avx(auVar27,0xaa);
                auVar27 = vblendvps_avx(auVar25,auVar23,auVar24);
                auVar23 = vblendvps_avx(auVar23,auVar25,auVar24);
                auVar25 = vpcmpgtd_avx(auVar9,auVar27);
                auVar24 = vpshufd_avx(auVar25,0xaa);
                auVar25 = vblendvps_avx(auVar9,auVar27,auVar24);
                auVar27 = vblendvps_avx(auVar27,auVar9,auVar24);
                auVar9 = vpcmpgtd_avx(auVar27,auVar23);
                auVar24 = vpshufd_avx(auVar9,0xaa);
                auVar9 = vblendvps_avx(auVar27,auVar23,auVar24);
                auVar23 = vblendvps_avx(auVar23,auVar27,auVar24);
                *pauVar18 = auVar23;
                pauVar18[1] = auVar9;
                uVar15 = auVar25._0_8_;
                pauVar18 = pauVar18 + 2;
              }
              else {
                lVar20 = 0;
                for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                  lVar20 = lVar20 + 1;
                }
                auVar29._8_8_ = 0;
                auVar29._0_8_ = *(ulong *)(uVar19 + lVar20 * 8);
                auVar10 = vpunpcklqdq_avx(auVar29,ZEXT416(*(uint *)(local_1058 + lVar20 * 4)));
                auVar24 = vpshufd_avx(auVar27,0xaa);
                auVar27 = vblendvps_avx(auVar25,auVar23,auVar24);
                auVar23 = vblendvps_avx(auVar23,auVar25,auVar24);
                auVar25 = vpcmpgtd_avx(auVar10,auVar9);
                auVar24 = vpshufd_avx(auVar25,0xaa);
                auVar25 = vblendvps_avx(auVar10,auVar9,auVar24);
                auVar9 = vblendvps_avx(auVar9,auVar10,auVar24);
                auVar24 = vpcmpgtd_avx(auVar9,auVar23);
                auVar10 = vpshufd_avx(auVar24,0xaa);
                auVar24 = vblendvps_avx(auVar9,auVar23,auVar10);
                auVar23 = vblendvps_avx(auVar23,auVar9,auVar10);
                auVar9 = vpcmpgtd_avx(auVar25,auVar27);
                auVar10 = vpshufd_avx(auVar9,0xaa);
                auVar9 = vblendvps_avx(auVar25,auVar27,auVar10);
                auVar25 = vblendvps_avx(auVar27,auVar25,auVar10);
                auVar27 = vpcmpgtd_avx(auVar24,auVar25);
                auVar10 = vpshufd_avx(auVar27,0xaa);
                auVar27 = vblendvps_avx(auVar24,auVar25,auVar10);
                auVar25 = vblendvps_avx(auVar25,auVar24,auVar10);
                *pauVar18 = auVar23;
                pauVar18[1] = auVar25;
                pauVar18[2] = auVar27;
                uVar15 = auVar9._0_8_;
                pauVar18 = pauVar18 + 3;
              }
            }
          }
          goto LAB_0148e568;
        }
        goto LAB_0148e540;
      }
      if ((uVar15 & 8) == 0) {
        auVar9 = vmaxps_avx(auVar23,*(undefined1 (*) [16])(uVar15 + 0x20));
        auVar24 = vminps_avx(auVar9,*(undefined1 (*) [16])(uVar15 + 0x30));
        auVar9 = vmaxps_avx(auVar25,*(undefined1 (*) [16])(uVar15 + 0x40));
        auVar9 = vminps_avx(auVar9,*(undefined1 (*) [16])(uVar15 + 0x50));
        auVar24 = vsubps_avx(auVar24,auVar23);
        auVar25 = vsubps_avx(auVar9,auVar25);
        auVar23 = vmaxps_avx(auVar27,*(undefined1 (*) [16])(uVar15 + 0x60));
        auVar23 = vminps_avx(auVar23,*(undefined1 (*) [16])(uVar15 + 0x70));
        auVar23 = vsubps_avx(auVar23,auVar27);
        local_1058._0_4_ =
             auVar24._0_4_ * auVar24._0_4_ + auVar25._0_4_ * auVar25._0_4_ +
             auVar23._0_4_ * auVar23._0_4_;
        local_1058._4_4_ =
             auVar24._4_4_ * auVar24._4_4_ + auVar25._4_4_ * auVar25._4_4_ +
             auVar23._4_4_ * auVar23._4_4_;
        fStack_1050 = auVar24._8_4_ * auVar24._8_4_ + auVar25._8_4_ * auVar25._8_4_ +
                      auVar23._8_4_ * auVar23._8_4_;
        fStack_104c = auVar24._12_4_ * auVar24._12_4_ + auVar25._12_4_ * auVar25._12_4_ +
                      auVar23._12_4_ * auVar23._12_4_;
        auVar23 = vcmpps_avx(_local_1058,auVar33._0_16_,2);
        auVar25 = vcmpps_avx(*(undefined1 (*) [16])(uVar15 + 0x20),
                             *(undefined1 (*) [16])(uVar15 + 0x30),2);
        auVar23 = vandps_avx(auVar23,auVar25);
        goto LAB_0148e5e0;
      }
LAB_0148e873:
      local_1030 = (ulong)((uint)uVar15 & 0xf) - 8;
      lVar20 = (uVar15 & 0xfffffffffffffff0) + 0x50;
      local_1020 = 0;
      for (local_1028 = 0; local_1028 != local_1030; local_1028 = local_1028 + 1) {
        bVar21 = 0;
        for (lVar22 = 0; (lVar22 != 4 && (*(int *)(lVar20 + lVar22 * 4) != -1)); lVar22 = lVar22 + 1
            ) {
          uVar14 = *(uint *)(lVar20 + -0x10 + lVar22 * 4);
          this = (context->scene->geometries).items[uVar14].ptr;
          context->geomID = uVar14;
          context->primID = *(uint *)(lVar20 + lVar22 * 4);
          bVar12 = Geometry::pointQuery(this,query,context);
          auVar33 = ZEXT1664(local_f88);
          auVar32 = ZEXT1664(local_fb8);
          auVar31 = ZEXT1664(local_fa8);
          auVar30 = ZEXT1664(local_f98);
          bVar21 = bVar21 | bVar12;
        }
        local_1020 = CONCAT71((int7)(local_1020 >> 8),(byte)local_1020 | bVar21);
        lVar20 = lVar20 + 0x60;
      }
    } while ((local_1020 & 1) == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar23._4_4_ = uVar1;
    auVar23._0_4_ = uVar1;
    auVar23._8_4_ = uVar1;
    auVar23._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar25._4_4_ = uVar1;
    auVar25._0_4_ = uVar1;
    auVar25._8_4_ = uVar1;
    auVar25._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar27._4_4_ = uVar1;
    auVar27._0_4_ = uVar1;
    auVar27._8_4_ = uVar1;
    auVar27._12_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_1048 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      local_1048 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    }
    bVar13 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }